

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O0

void * PointLight_create(void)

{
  PointLight *self;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  Light *local_60;
  undefined4 local_54;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_50;
  undefined4 local_44;
  undefined1 *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 local_4;
  
  local_60 = (Light *)embree::alignedUSMMalloc
                                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,DEFAULT);
  embree::Light_Constructor(local_60);
  local_60->type = LIGHT_POINT;
  local_50 = &local_78;
  local_54 = 0;
  local_4 = 0;
  local_18 = 0;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_44 = 0x3f800000;
  local_28 = 0x3f800000;
  local_38 = 0x3f800000;
  uStack_34 = 0x3f800000;
  uStack_30 = 0x3f800000;
  uStack_2c = 0x3f800000;
  local_40 = &stack0xffffffffffffff78;
  PointLight_set(local_60,(Vec3fa *)&local_78.field_1,(Vec3fa *)&stack0xffffffffffffff78,0.0);
  return local_60;
}

Assistant:

void* PointLight_create()
{
  PointLight* self = (PointLight*) alignedUSMMalloc(sizeof(PointLight),16);
  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(PointLight_sample);
  //self->super.eval = GET_FUNCTION_POINTER(PointLight_eval);
  self->super.type = LIGHT_POINT;

  PointLight_set(self, Vec3fa(0.f), Vec3fa(1.f), 0.f);
  return self;
}